

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_SetJoin.cpp
# Opt level: O0

void __thiscall
SetJoinGameCommand::trigger
          (SetJoinGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  string_view sVar1;
  Config *pCVar2;
  PlayerInfo *pPVar3;
  PlayerInfo *pPVar4;
  bool bVar5;
  size_type sVar6;
  char *pcVar7;
  size_type sVar8;
  const_pointer pvVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  size_t local_c8;
  char *local_c0;
  string local_a8;
  __sv_type local_88;
  allocator<char> local_61;
  string local_60 [32];
  __sv_type local_40;
  PlayerInfo *local_30;
  PlayerInfo *player_local;
  Server *source_local;
  SetJoinGameCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (SetJoinGameCommand *)parameters._M_len;
  local_30 = player;
  player_local = (PlayerInfo *)source;
  source_local = (Server *)this;
  bVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&player->uuid);
  pPVar4 = player_local;
  pPVar3 = local_30;
  if (bVar5) {
    bVar10 = sv("Error: A setjoin message requires steam.",0x28);
    local_c8 = bVar10._M_len;
    local_c0 = bVar10._M_str;
    RenX::Server::sendMessage(pPVar4,pPVar3,local_c8,local_c0);
  }
  else {
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pCVar2 = pluginInstance.setjoin_file;
    if (bVar5) {
      sVar1._M_str = (char *)parameters_local._M_len;
      sVar1._M_len = (size_t)this_local;
      DelJoinGameCommand::trigger
                (&DelJoinGameCommand_instance,(Server *)player_local,local_30,sVar1);
    }
    else {
      local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_30->uuid)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_60,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_61)
      ;
      Jupiter::Config::set(pCVar2,local_40._M_len,local_40._M_str,local_60);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
      Jupiter::Config::write();
      pPVar4 = player_local;
      pPVar3 = local_30;
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (&local_30->name);
      pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                         (&local_30->name);
      sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pvVar9 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      string_printf_abi_cxx11_
                (&local_a8,"%.*s, your join message is now: %.*s",sVar6,pcVar7,sVar8,pvVar9);
      local_88 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a8);
      RenX::Server::sendMessage(pPVar4,pPVar3,local_88._M_len,local_88._M_str);
      std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  return;
}

Assistant:

void SetJoinGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (!player->uuid.empty()) {
		if (!parameters.empty()) {
			pluginInstance.setjoin_file.set(player->uuid, static_cast<std::string>(parameters));
			pluginInstance.setjoin_file.write();
			source->sendMessage(*player, string_printf("%.*s, your join message is now: %.*s", player->name.size(), player->name.data(), parameters.size(),
				parameters.data()));
		}
		else DelJoinGameCommand_instance.trigger(source, player, parameters);
	}
	else source->sendMessage(*player, "Error: A setjoin message requires steam."sv);
}